

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactoryTest_test_setting_nds_with_Tenors_Test::
~SubjectFactoryTest_test_setting_nds_with_Tenors_Test
          (SubjectFactoryTest_test_setting_nds_with_Tenors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_nds_with_Tenors)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=USD,DealType=NDS,FarCurrency=USD,FarQuantity=850000.00,FarTenor=3M,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,Symbol=USDCNY,Tenor=1M,User=fbennett",
            subject_factory.Fx().Stream().Nds()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("USDCNY")
                    .Currency("USD")
                    .NearQuantity(1000000)
                    .NearTenor(Tenor::IN_1_MONTH)
                    .FarQuantity(850000)
                    .FarTenor(Tenor::IN_3_MONTHS)
                    .CreateSubject()
                    .ToString().c_str());
}